

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

double __thiscall
mjs::anon_unknown_35::parse_int(anon_unknown_35 *this,wstring_view s,int radix,version ver)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  const_reference pvVar4;
  size_type sVar5;
  wstring_view wVar6;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar7;
  int local_a4;
  ulong uStack_90;
  int val;
  size_t i;
  double value;
  wchar_t *local_78;
  double local_70;
  wchar_t *local_68;
  double local_60;
  wchar_t *local_58;
  int local_4c;
  int sign;
  double local_38;
  wchar_t *local_30;
  int local_24;
  version ver_local;
  int radix_local;
  wstring_view s_local;
  
  wVar6._M_len = s._M_len;
  local_24 = (int)s._M_str;
  wVar6._M_str._0_4_ = radix;
  wVar6._M_str._4_4_ = 0;
  _ver_local = this;
  s_local._M_len = wVar6._M_len;
  wVar6 = ltrim((mjs *)this,wVar6,radix);
  local_38 = (double)wVar6._M_len;
  _ver_local = (anon_unknown_35 *)local_38;
  local_30 = wVar6._M_str;
  s_local._M_len = (size_t)local_30;
  local_4c = 1;
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local);
  if ((!bVar1) &&
     ((pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,0),
      *pvVar4 == 0x2b ||
      (pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,0),
      *pvVar4 == 0x2d)))) {
    pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,0);
    if (*pvVar4 == 0x2d) {
      local_4c = -1;
    }
    bVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,1,
                       0xffffffffffffffff);
    local_60 = (double)bVar7._M_len;
    _ver_local = (anon_unknown_35 *)local_60;
    local_58 = bVar7._M_str;
    s_local._M_len = (size_t)local_58;
  }
  if (local_24 != 0) {
    if ((local_24 < 2) || (0x24 < local_24)) {
      return NAN;
    }
    if (((local_24 == 0x10) &&
        (sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local),
        1 < sVar5)) &&
       (pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,0),
       *pvVar4 == 0x30)) {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,1);
      iVar2 = tolower(*pvVar4);
      if (iVar2 == 0x78) {
        bVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,2,
                           0xffffffffffffffff);
        local_70 = (double)bVar7._M_len;
        _ver_local = (anon_unknown_35 *)local_70;
        local_68 = bVar7._M_str;
        s_local._M_len = (size_t)local_68;
      }
    }
  }
  if (local_24 == 0) {
    bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local);
    if ((bVar1) ||
       (pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,0),
       *pvVar4 != 0x30)) {
      local_24 = 10;
    }
    else {
      sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local);
      if (1 < sVar5) {
        pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,1);
        iVar2 = tolower(*pvVar4);
        if (iVar2 == 0x78) {
          local_24 = 0x10;
          bVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,2,
                             0xffffffffffffffff);
          value = (double)bVar7._M_len;
          _ver_local = (anon_unknown_35 *)value;
          local_78 = bVar7._M_str;
          s_local._M_len = (size_t)local_78;
          goto LAB_001731b2;
        }
      }
      local_24 = 8;
      if (1 < radix) {
        local_24 = 10;
      }
    }
  }
LAB_001731b2:
  i = 0x7ff8000000000000;
  if (local_24 < 2 || 0x24 < local_24) {
    __assert_fail("radix >= 2 && radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                  ,0x40,
                  "double mjs::(anonymous namespace)::parse_int(std::wstring_view, int, version)");
  }
  for (uStack_90 = 0;
      sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local),
      uStack_90 < sVar5; uStack_90 = uStack_90 + 1) {
    pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,
                        uStack_90);
    iVar2 = isdigit(*pvVar4);
    if (iVar2 == 0) {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,
                          uStack_90);
      iVar2 = isalpha(*pvVar4);
      if (iVar2 == 0) break;
    }
    pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,
                        uStack_90);
    if (*pvVar4 < 0x3a) {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,
                          uStack_90);
      local_a4 = *pvVar4 + -0x30;
    }
    else {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&ver_local,
                          uStack_90);
      local_a4 = tolower(*pvVar4);
      local_a4 = local_a4 + -0x57;
    }
    if (local_24 <= local_a4) break;
    uVar3 = std::isnan((double)i);
    if ((uVar3 & 1) != 0) {
      i = 0;
    }
    i = (size_t)((double)i * (double)local_24 + (double)local_a4);
  }
  return (double)local_4c * (double)i;
}

Assistant:

double parse_int(std::wstring_view s, int radix, version ver) {
    s = ltrim(s, ver);
    int sign = 1;
    if (!s.empty() && (s[0] == '+' || s[0] == '-')) {
        if (s[0] == '-') sign = -1;
        s = s.substr(1);
    }
    // Result(5) = s
    if (radix != 0) {
        if (radix < 2 || radix > 36) {
            return NAN;
        }
        if (radix == 16 && s.length() >= 2 && s[0] == '0' && tolower(s[1]) == 'x') {
            s = s.substr(2);
        }
    }
    if (radix == 0) {
        if (s.empty() || s[0] != '0') {
            radix = 10;
        } else {
            if (s.size() >= 2 && tolower(s[1]) == 'x') {
                radix = 16;
                s = s.substr(2);
            } else {
                radix = ver >= version::es5 ? 10 : 8;
            }
        }
    }

    double value = NAN;

    assert(radix >= 2 && radix <= 36);
    for (size_t i = 0; i < s.length(); ++i) {
        if (!isdigit(s[i]) && !isalpha(s[i])) {
            break;
        }
        const int val = s[i]>'9' ? 10+tolower(s[i])-'a' : s[i]-'0';
        if (val >= radix) {
            break;
        }
        if (std::isnan(value)) value = 0;
        value = value*radix + val;
    }

    return sign * value;
}